

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTable.cpp
# Opt level: O0

void __thiscall UnitTest_table2::Run(UnitTest_table2 *this)

{
  bool bVar1;
  undefined1 uVar2;
  anon_union_8_9_8deb4486_for_Value_0 this_00;
  anon_union_8_9_8deb4486_for_Value_0 error;
  ValueT VVar3;
  Value VVar4;
  Value key_not_existed;
  Value value;
  Value key;
  String value_str;
  String key_str;
  Table t;
  undefined7 in_stack_fffffffffffffd60;
  undefined1 in_stack_fffffffffffffd67;
  Value *in_stack_fffffffffffffd68;
  allocator *paVar5;
  String *in_stack_fffffffffffffd70;
  Table *in_stack_fffffffffffffd78;
  undefined7 in_stack_fffffffffffffd80;
  undefined1 in_stack_fffffffffffffd87;
  string *in_stack_fffffffffffffd98;
  UnitTestBase *in_stack_fffffffffffffda0;
  Value *in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdb0;
  allocator local_231;
  Value *in_stack_fffffffffffffdd0;
  Value *in_stack_fffffffffffffdd8;
  Table *in_stack_fffffffffffffde0;
  allocator local_209;
  string local_208 [39];
  allocator local_1e1;
  string local_1e0 [39];
  allocator local_1b9;
  string local_1b8 [39];
  allocator local_191;
  string local_190 [32];
  anon_union_8_9_8deb4486_for_Value_0 local_170;
  ValueT local_168;
  anon_union_8_9_8deb4486_for_Value_0 local_160;
  ValueT local_158;
  anon_union_8_9_8deb4486_for_Value_0 local_150;
  undefined4 local_148;
  undefined1 local_139 [40];
  undefined1 local_111 [33];
  anon_union_8_9_8deb4486_for_Value_0 local_f0;
  ValueT local_e8;
  anon_union_8_9_8deb4486_for_Value_0 local_e0;
  ValueT local_d8;
  anon_union_8_9_8deb4486_for_Value_0 local_d0;
  ValueT local_c8;
  anon_union_8_9_8deb4486_for_Value_0 local_c0;
  undefined4 local_b8;
  GCObject local_b0 [3];
  GCObject local_68 [4];
  
  luna::Table::Table((Table *)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60));
  luna::String::String(in_stack_fffffffffffffd70,(char *)in_stack_fffffffffffffd68);
  luna::String::String(in_stack_fffffffffffffd70,(char *)in_stack_fffffffffffffd68);
  luna::Value::Value((Value *)&local_c0);
  luna::Value::Value((Value *)&local_d0);
  local_b8 = 3;
  local_c0.obj_ = local_68;
  local_c8 = 3;
  local_d0.obj_ = local_b0;
  luna::Table::SetValue
            (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
  VVar4 = luna::Table::GetValue
                    ((Table *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
                     (Value *)in_stack_fffffffffffffd78);
  this_00 = VVar4.field_0;
  VVar3 = VVar4.type_;
  local_f0 = this_00;
  local_e8 = VVar3;
  local_e0 = this_00;
  local_d8 = VVar3;
  local_d0 = this_00;
  local_c8 = VVar3;
  if (VVar3 != ValueT_Obj) {
    in_stack_fffffffffffffda8 = (Value *)local_111;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_111 + 1),"\'value.type_ == luna::ValueT_Obj\'",
               (allocator *)in_stack_fffffffffffffda8);
    UnitTestBase::Error(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
    std::__cxx11::string::~string((string *)(local_111 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_111);
  }
  if (local_d0.obj_ != local_b0) {
    in_stack_fffffffffffffda0 = (UnitTestBase *)local_139;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_139 + 1),"\'value.obj_ == &value_str\'",
               (allocator *)in_stack_fffffffffffffda0);
    UnitTestBase::Error(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
    std::__cxx11::string::~string((string *)(local_139 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_139);
  }
  luna::Value::Value((Value *)&local_150);
  local_148 = 3;
  local_150.obj_ = local_b0;
  VVar4 = luna::Table::GetValue
                    ((Table *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
                     (Value *)in_stack_fffffffffffffd78);
  error = VVar4.field_0;
  local_168 = VVar4.type_;
  local_170 = error;
  local_160 = error;
  local_158 = local_168;
  local_d0 = error;
  local_c8 = local_168;
  if (local_168 != ValueT_Nil) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_190,"\'value.type_ == luna::ValueT_Nil\'",&local_191);
    UnitTestBase::Error(in_stack_fffffffffffffda0,(string *)error.obj_);
    std::__cxx11::string::~string(local_190);
    std::allocator<char>::~allocator((allocator<char> *)&local_191);
  }
  bVar1 = luna::Table::FirstKeyValue
                    (in_stack_fffffffffffffd78,(Value *)in_stack_fffffffffffffd70,
                     in_stack_fffffffffffffd68);
  if (!bVar1) {
    paVar5 = &local_1b9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1b8,"\'t.FirstKeyValue(key, value)\'",paVar5);
    UnitTestBase::Error(in_stack_fffffffffffffda0,(string *)error.obj_);
    std::__cxx11::string::~string(local_1b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
  }
  if (local_c0.obj_ != local_68) {
    paVar5 = &local_1e1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1e0,"\'key.obj_ == &key_str\'",paVar5);
    UnitTestBase::Error(in_stack_fffffffffffffda0,(string *)error.obj_);
    std::__cxx11::string::~string(local_1e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
  }
  if (local_d0.obj_ != local_b0) {
    paVar5 = &local_209;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_208,"\'value.obj_ == &value_str\'",paVar5);
    UnitTestBase::Error(in_stack_fffffffffffffda0,(string *)error.obj_);
    std::__cxx11::string::~string(local_208);
    std::allocator<char>::~allocator((allocator<char> *)&local_209);
  }
  uVar2 = luna::Table::NextKeyValue
                    (this_00.table_,(Value *)CONCAT44(VVar3,in_stack_fffffffffffffdb0),
                     in_stack_fffffffffffffda8,(Value *)in_stack_fffffffffffffda0);
  if ((bool)uVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xfffffffffffffdd0,"\'!t.NextKeyValue(key, key, value)\'",&local_231)
    ;
    UnitTestBase::Error(in_stack_fffffffffffffda0,(string *)error.obj_);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffdd0);
    std::allocator<char>::~allocator((allocator<char> *)&local_231);
  }
  luna::String::~String((String *)CONCAT17(uVar2,in_stack_fffffffffffffd60));
  luna::String::~String((String *)CONCAT17(uVar2,in_stack_fffffffffffffd60));
  luna::Table::~Table((Table *)CONCAT17(uVar2,in_stack_fffffffffffffd60));
  return;
}

Assistant:

TEST_CASE(table2)
{
    luna::Table t;
    luna::String key_str("key");
    luna::String value_str("value");

    luna::Value key;
    luna::Value value;

    key.type_ = luna::ValueT_Obj;
    key.obj_ = &key_str;
    value.type_ = luna::ValueT_Obj;
    value.obj_ = &value_str;

    t.SetValue(key, value);
    value = t.GetValue(key);

    EXPECT_TRUE(value.type_ == luna::ValueT_Obj);
    EXPECT_TRUE(value.obj_ == &value_str);

    luna::Value key_not_existed;
    key_not_existed.type_ = luna::ValueT_Obj;
    key_not_existed.obj_ = &value_str;

    value = t.GetValue(key_not_existed);
    EXPECT_TRUE(value.type_ == luna::ValueT_Nil);

    EXPECT_TRUE(t.FirstKeyValue(key, value));
    EXPECT_TRUE(key.obj_ == &key_str);
    EXPECT_TRUE(value.obj_ == &value_str);

    EXPECT_TRUE(!t.NextKeyValue(key, key, value));
}